

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

int look_here(int obj_cnt,boolean picked_some)

{
  monst *mon;
  boolean bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  trap *ptVar6;
  size_t sVar7;
  level *plVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  undefined7 in_register_00000031;
  obj *poVar12;
  long lVar13;
  vptrs *pvVar14;
  bool bVar15;
  int size;
  nh_objitem *items;
  char *local_258;
  level *local_250;
  char *local_248;
  obj *local_240;
  char fbuf [256];
  char fbuf2 [256];
  
  iVar9 = iflags.pilesize;
  local_250 = (level *)CONCAT44(local_250._4_4_,(int)CONCAT71(in_register_00000031,picked_some));
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001aa8e1;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001aa8dc;
    pcVar10 = "see";
  }
  else {
LAB_001aa8dc:
    if (ublindf == (obj *)0x0) {
      pcVar10 = "feel";
    }
    else {
LAB_001aa8e1:
      pcVar10 = "feel";
      if (ublindf->oartifact == '\x1d') {
        pcVar10 = "see";
      }
    }
  }
  size = 10;
  items = (nh_objitem *)0x0;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001aa949;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001aa944;
    local_258 = "Things that are here:";
  }
  else {
LAB_001aa944:
    if (ublindf == (obj *)0x0) {
      local_258 = "Things that you feel here:";
    }
    else {
LAB_001aa949:
      local_258 = "Things that you feel here:";
      if (ublindf->oartifact == '\x1d') {
        local_258 = "Things that are here:";
      }
    }
  }
  bVar1 = update_location(obj_cnt <= iflags.pilesize);
  mon = u.ustuck;
  if ((u.ustuck != (monst *)0x0 & u._1052_1_) == 1) {
    pcVar4 = mon_nam(u.ustuck);
    pcVar4 = s_suffix(pcVar4);
    pcVar5 = mbodypart(mon,0x12);
    sprintf(fbuf,"Contents of %s %s",pcVar4,pcVar5);
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001aaa1a;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001aaa11;
      pcVar4 = "look around";
    }
    else {
LAB_001aaa11:
      if (ublindf == (obj *)0x0) {
        pcVar4 = "try";
      }
      else {
LAB_001aaa1a:
        pcVar4 = "try";
        if (ublindf->oartifact == '\x1d') {
          pcVar4 = "look around";
        }
      }
    }
    pline("You %s to %s what is lying in %s.",pcVar4,pcVar10,fbuf + 0xc);
    poVar12 = mon->minvent;
    if (poVar12 == (obj *)0x0) {
      pline("You %s no objects here.",pcVar10);
    }
    else {
      for (; poVar12 != (obj *)0x0; poVar12 = poVar12->nobj) {
        if ((poVar12->otyp == 0x10e) && (bVar1 = will_feel_cockatrice(poVar12,'\0'), bVar1 != '\0'))
        {
          if (u.uprops[0x21].intrinsic == 0) {
            pcVar4 = doname_price(poVar12);
            pline("You %s here %s.",pcVar10,pcVar4);
            goto LAB_001aaf64;
          }
          break;
        }
      }
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001aac70;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001aac6b;
      }
      else {
LAB_001aac6b:
        if (ublindf != (obj *)0x0) {
LAB_001aac70:
          if (ublindf->oartifact == '\x1d') goto LAB_001aac8a;
        }
        builtin_strncpy(fbuf,"You feel",9);
      }
LAB_001aac8a:
      sVar7 = strlen(fbuf);
      (fbuf + sVar7)[0] = ':';
      (fbuf + sVar7)[1] = '\0';
      display_minventory(mon,2,fbuf);
    }
    goto LAB_001aacac;
  }
  if (((obj_cnt <= iVar9) && (ptVar6 = t_at(level,(int)u.ux,(int)u.uy), ptVar6 != (trap *)0x0)) &&
     ((ptVar6->field_0x8 & 0x20) != 0)) {
    pcVar4 = an(defexplain[(ulong)((byte)ptVar6->field_0x8 & 0x1f) + 0x2f]);
    pline("There is %s here.",pcVar4);
  }
  local_240 = level->objects[(int)u.ux][(int)u.uy];
  pcVar4 = dfeature_at((int)u.ux,(int)u.uy,fbuf2);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    iVar3 = strcmp(pcVar4,"pool of water");
    if ((iVar3 == 0) && ((u._1052_1_ & 2) != 0)) {
      pcVar4 = (char *)0x0;
    }
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001aab3e;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001aab39;
  }
  else {
LAB_001aab39:
    if (ublindf != (obj *)0x0) {
LAB_001aab3e:
      if (ublindf->oartifact == '\x1d') goto LAB_001aad66;
    }
    local_248 = pcVar10;
    bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level);
    bVar15 = true;
    if (bVar2 == '\0') {
      bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
      bVar15 = bVar2 != '\0';
    }
    if ((pcVar4 == (char *)0x0) || (iVar3 = strncmp(pcVar4,"altar ",6), iVar3 != 0)) {
      pcVar10 = "floating here";
      if (bVar15) {
        pcVar5 = "";
      }
      else {
        pcVar10 = "lying here on the ";
        pcVar5 = surface((int)u.ux,(int)u.uy);
      }
      pline("You try to feel what is %s%s.",pcVar10,pcVar5);
    }
    else {
      pline("You try to feel what is here.");
    }
    if (!bVar15 && pcVar4 != (char *)0x0) {
      pcVar10 = surface((int)u.ux,(int)u.uy);
      iVar3 = strcmp(pcVar4,pcVar10);
      if (iVar3 == 0) {
        pcVar4 = (char *)0x0;
      }
    }
    pcVar10 = local_248;
    bVar2 = can_reach_floor();
    if (bVar2 == '\0') {
      bVar15 = false;
      pline("But you can\'t reach it!");
      goto LAB_001aaf6d;
    }
  }
LAB_001aad66:
  if (pcVar4 != (char *)0x0) {
    pcVar5 = an(pcVar4);
    sprintf(fbuf,"There is %s here.",pcVar5);
  }
  if (((local_240 == (obj *)0x0) || (bVar2 = is_lava(level,(int)u.ux,(int)u.uy), bVar2 != '\0')) ||
     ((bVar2 = is_pool(level,(int)u.ux,(int)u.uy), poVar12 = local_240, bVar2 != '\0' &&
      ((u._1052_1_ & 2) == 0)))) {
    if (pcVar4 != (char *)0x0) {
      pline(fbuf);
    }
    read_engr_at((int)u.ux,(int)u.uy);
    if (iVar9 < obj_cnt) {
LAB_001aaf11:
      if (u.uprops[0x1e].intrinsic != 0) goto LAB_001aaf37;
    }
    else {
      if (u.uprops[0x1e].intrinsic != 0) {
LAB_001aade9:
        if (ublindf != (obj *)0x0) {
LAB_001aadf2:
          if ((pcVar4 != (char *)0x0) && (ublindf->oartifact == '\x1d')) goto LAB_001aaf11;
        }
LAB_001aaef6:
        pline("You %s no objects here.",pcVar10);
        goto LAB_001aaf11;
      }
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001aadf2;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001aade9;
      if (pcVar4 == (char *)0x0) goto LAB_001aaef6;
    }
LAB_001aaf15:
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        bVar15 = false;
        goto LAB_001aaf6d;
      }
LAB_001aaf37:
      if (ublindf == (obj *)0x0) goto LAB_001aaf6b;
    }
    bVar15 = ublindf->oartifact != '\x1d';
  }
  else {
    if (iVar9 < obj_cnt) {
      if (pcVar4 != (char *)0x0) {
        pline(fbuf);
      }
      read_engr_at((int)u.ux,(int)u.uy);
      pcVar10 = "many";
      if (obj_cnt < 0xb) {
        pcVar10 = "several";
      }
      pcVar4 = " more";
      if ((char)local_250 == '\0') {
        pcVar4 = "";
      }
      pline("There are %s%s objects here.",pcVar10,pcVar4);
LAB_001aacac:
      if (u.uprops[0x1e].intrinsic == 0) goto LAB_001aaf15;
      goto LAB_001aaf37;
    }
    if ((local_240->v).v_nexthere != (obj *)0x0) {
      lVar13 = (long)u.ux;
      local_250 = level;
      lVar11 = (long)u.uy;
      pvVar14 = (vptrs *)(level->objects[lVar13] + lVar11);
      while (poVar12 = pvVar14->v_nexthere, poVar12 != (obj *)0x0) {
        if ((poVar12->otyp == 0x10e) && (bVar2 = will_feel_cockatrice(poVar12,'\0'), bVar2 != '\0'))
        {
          if (u.uprops[0x21].intrinsic == 0) {
            pcVar4 = doname_price(poVar12);
            pline("You %s here %s.",pcVar10,pcVar4);
            goto LAB_001aaf64;
          }
          break;
        }
        pvVar14 = &poVar12->v;
      }
      items = (nh_objitem *)malloc((long)size * 0x124);
      if (pcVar4 == (char *)0x0) {
        iVar9 = 0;
        plVar8 = local_250;
      }
      else {
        add_objitem(&items,&size,MI_TEXT,0,0,fbuf,(obj *)0x0,'\0');
        add_objitem(&items,&size,MI_TEXT,1,0,"",(obj *)0x0,'\0');
        lVar13 = (long)u.ux;
        lVar11 = (long)u.uy;
        iVar9 = 2;
        plVar8 = level;
      }
      pvVar14 = (vptrs *)(plVar8->objects[lVar13] + lVar11);
      while (poVar12 = pvVar14->v_nexthere, poVar12 != (obj *)0x0) {
        pcVar10 = doname(poVar12);
        add_objitem(&items,&size,MI_NORMAL,iVar9,0,pcVar10,poVar12,'\0');
        iVar9 = iVar9 + 1;
        pvVar14 = &poVar12->v;
      }
      if (obj_cnt == 0 || bVar1 == '\0') {
        display_objects(items,iVar9,local_258,0,(nh_objresult *)0x0);
      }
      free(items);
      read_engr_at((int)u.ux,(int)u.uy);
      goto LAB_001aacac;
    }
    if (pcVar4 != (char *)0x0) {
      pline(fbuf);
    }
    read_engr_at((int)u.ux,(int)u.uy);
    pcVar4 = doname_price(poVar12);
    pline("You %s here %s.",pcVar10,pcVar4);
    if (((poVar12->otyp != 0x10e) || (bVar1 = will_feel_cockatrice(poVar12,'\0'), bVar1 == '\0')) ||
       (u.uprops[0x21].intrinsic != 0)) goto LAB_001aacac;
LAB_001aaf64:
    feel_cockatrice(poVar12,'\0');
LAB_001aaf6b:
    bVar15 = true;
  }
LAB_001aaf6d:
  return (int)bVar15;
}

Assistant:

int look_here(int obj_cnt, /* obj_cnt > 0 implies that autopickup is in progess */
	      boolean picked_some)
{
	struct obj *otmp;
	struct trap *trap;
	const char *verb = Blind ? "feel" : "see";
	const char *dfeature = NULL;
	char fbuf[BUFSZ], fbuf2[BUFSZ];
	boolean skip_objects = (obj_cnt > iflags.pilesize);
	int icount = 0;
	int size = 10;
	struct nh_objitem *items = NULL;
	const char *title = Blind ? "Things that you feel here:" :
				    "Things that are here:";

	/* show the "things that are here" window iff
	 * - the player didn't get the info via update_location -OR-
	 * - it was explicitly requested (obj_cnt == 0) */
	boolean skip_win = update_location(!skip_objects) && obj_cnt;

	if (u.uswallow && u.ustuck) {
	    struct monst *mtmp = u.ustuck;
	    sprintf(fbuf, "Contents of %s %s",
		s_suffix(mon_nam(mtmp)), mbodypart(mtmp, STOMACH));
	    /* Skip "Contents of " by using fbuf index 12 */
	    pline("You %s to %s what is lying in %s.",
		Blind ? "try" : "look around", verb, &fbuf[12]);
	    otmp = mtmp->minvent;
	    if (otmp) {
		for ( ; otmp; otmp = otmp->nobj) {
		    /* If swallower is an animal, it should have become stone but... */
		    if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE))
			break;
		}
		if (otmp && !Stoned) {
		    pline("You %s here %s.", verb, doname_price(otmp));
		    feel_cockatrice(otmp, FALSE);
		    return 1;
		}
		if (Blind) strcpy(fbuf, "You feel");
		strcat(fbuf,":");
		display_minventory(mtmp, MINV_ALL, fbuf);
	    } else {
		pline("You %s no objects here.", verb);
	    }
	    return !!Blind;
	}
	if (!skip_objects && (trap = t_at(level, u.ux, u.uy)) && trap->tseen)
		pline("There is %s here.",
			an(trapexplain[trap->ttyp - 1]));

	otmp = level->objects[u.ux][u.uy];
	dfeature = dfeature_at(u.ux, u.uy, fbuf2);
	if (dfeature && !strcmp(dfeature, "pool of water") && Underwater)
		dfeature = NULL;

	if (Blind) {
		boolean drift = Is_airlevel(&u.uz) || Is_waterlevel(&u.uz);
		if (dfeature && !strncmp(dfeature, "altar ", 6)) {
		    /* don't say "altar" twice, dfeature has more info */
		    pline("You try to feel what is here.");
		} else {
		    pline("You try to feel what is %s%s.",
			drift ? "floating here" : "lying here on the ",
			drift ? ""		: surface(u.ux, u.uy));
		}
		if (dfeature && !drift && !strcmp(dfeature, surface(u.ux,u.uy)))
			dfeature = NULL;	/* ice already identifed */
		if (!can_reach_floor()) {
			pline("But you can't reach it!");
			return 0;
		}
	}

	if (dfeature)
		sprintf(fbuf, "There is %s here.", an(dfeature));

	if (!otmp || is_lava(level, u.ux, u.uy) || (is_pool(level, u.ux, u.uy) && !Underwater)) {
		if (dfeature) pline(fbuf);
		read_engr_at(u.ux, u.uy);
		if (!skip_objects && (Blind || !dfeature))
		    pline("You %s no objects here.", verb);
		return !!Blind;
	}
	/* we know there is something here */

	if (skip_objects) {
	    if (dfeature) pline(fbuf);
	    read_engr_at(u.ux, u.uy);
	    pline("There are %s%s objects here.",
		  (obj_cnt <= 10) ? "several" : "many",
		  picked_some ? " more" : "");

	} else if (!otmp->nexthere) {
	    /* only one object */
	    if (dfeature) pline(fbuf);
	    read_engr_at(u.ux, u.uy);
#ifdef INVISIBLE_OBJECTS
	    if (otmp->oinvis && !See_invisible) verb = "feel";
#endif
	    pline("You %s here %s.", verb, doname_price(otmp));
	    if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE) && !Stoned) {
		feel_cockatrice(otmp, FALSE);
		return 1;
	    }

	} else {
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE))
		    break;
	    }
	    if (otmp && !Stoned) {
		pline("You %s here %s.", verb, doname_price(otmp));
		feel_cockatrice(otmp, FALSE);
		return 1;
	    }

	    items = malloc(size * sizeof(struct nh_objitem));
	    if (dfeature) {
		add_objitem(&items, &size, MI_TEXT, icount++, 0, fbuf, NULL, FALSE);
		add_objitem(&items, &size, MI_TEXT, icount++, 0, "", NULL, FALSE);
	    }

	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		add_objitem(&items, &size, MI_NORMAL, icount++, 0,
			    doname(otmp), otmp, FALSE);
	    }

	    if (!skip_win)
		display_objects(items, icount, title, PICK_NONE, NULL);
	    free(items);

	    read_engr_at(u.ux, u.uy);
	}
	return !!Blind;
}